

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O0

void __thiscall ipx::Iterate::Iterate(Iterate *this,Model *model)

{
  bool bVar1;
  Int IVar2;
  Int IVar3;
  Vector *this_00;
  Vector *this_01;
  double *pdVar4;
  reference pvVar5;
  Model *in_RSI;
  undefined8 *in_RDI;
  Int j;
  Vector *ub;
  Vector *lb;
  Int n;
  Int m;
  double in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  valarray<double> *in_stack_fffffffffffffea0;
  size_type in_stack_fffffffffffffea8;
  Iterate *in_stack_fffffffffffffeb0;
  int local_3c;
  
  *in_RDI = in_RSI;
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 1));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 3));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 5));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 7));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 9));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0xb));
  std::vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>::vector
            ((vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_> *)
             0x82c853);
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x10));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x12));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x14));
  std::valarray<double>::valarray((valarray<double> *)(in_RDI + 0x16));
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 0;
  *(undefined1 *)(in_RDI + 0x21) = 0;
  *(undefined1 *)((long)in_RDI + 0x109) = 0;
  in_RDI[0x22] = 0x3eb0c6f7a0b5ed8d;
  in_RDI[0x23] = 0x3e45798ee2308c3a;
  in_RDI[0x24] = 0xbff0000000000000;
  IVar2 = Model::rows((Model *)*in_RDI);
  IVar3 = Model::cols((Model *)*in_RDI);
  this_00 = Model::lb(in_RSI);
  this_01 = Model::ub(in_RSI);
  std::valarray<double>::resize
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::valarray<double>::resize
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::valarray<double>::resize
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::valarray<double>::resize
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::valarray<double>::resize
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::valarray<double>::resize
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::valarray<double>::resize
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::valarray<double>::resize
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::valarray<double>::resize
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::valarray<double>::resize
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>::resize
            ((vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_> *)
             in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_3c = 0;
  do {
    if (IVar3 + IVar2 <= local_3c) {
      assert_consistency(in_stack_fffffffffffffeb0);
      return;
    }
    pdVar4 = std::valarray<double>::operator[](this_00,(long)local_3c);
    bVar1 = std::isfinite(*pdVar4);
    if (bVar1) {
      pdVar4 = std::valarray<double>::operator[](this_01,(long)local_3c);
      bVar1 = std::isfinite(*pdVar4);
      if (!bVar1) goto LAB_0082ce7f;
      pvVar5 = std::vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>::
               operator[]((vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                           *)(in_RDI + 0xd),(long)local_3c);
      *pvVar5 = BARRIER_BOXED;
      pdVar4 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 3),(long)local_3c);
      *pdVar4 = 1.0;
      pdVar4 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 5),(long)local_3c);
      *pdVar4 = 1.0;
      pdVar4 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_3c);
      *pdVar4 = 1.0;
      pdVar4 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0xb),(long)local_3c);
      *pdVar4 = 1.0;
    }
    else {
LAB_0082ce7f:
      pdVar4 = std::valarray<double>::operator[](this_00,(long)local_3c);
      bVar1 = std::isfinite(*pdVar4);
      if (bVar1) {
        pvVar5 = std::vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                 ::operator[]((vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                               *)(in_RDI + 0xd),(long)local_3c);
        *pvVar5 = BARRIER_LB;
        pdVar4 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 3),(long)local_3c);
        *pdVar4 = 1.0;
        pdVar4 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 5),(long)local_3c);
        *pdVar4 = INFINITY;
        pdVar4 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_3c);
        *pdVar4 = 1.0;
        pdVar4 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0xb),(long)local_3c);
        *pdVar4 = 0.0;
      }
      else {
        pdVar4 = std::valarray<double>::operator[](this_01,(long)local_3c);
        bVar1 = std::isfinite(*pdVar4);
        if (bVar1) {
          pvVar5 = std::
                   vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>::
                   operator[]((vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                               *)(in_RDI + 0xd),(long)local_3c);
          *pvVar5 = BARRIER_UB;
          pdVar4 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 3),(long)local_3c);
          *pdVar4 = INFINITY;
          pdVar4 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 5),(long)local_3c);
          *pdVar4 = 1.0;
          in_stack_fffffffffffffeb0 =
               (Iterate *)
               std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_3c);
          in_stack_fffffffffffffeb0->model_ = (Model *)0x0;
          pdVar4 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 0xb),(long)local_3c);
          *pdVar4 = 1.0;
        }
        else {
          pvVar5 = std::
                   vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>::
                   operator[]((vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                               *)(in_RDI + 0xd),(long)local_3c);
          *pvVar5 = FREE;
          pdVar4 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 3),(long)local_3c);
          *pdVar4 = INFINITY;
          pdVar4 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 5),(long)local_3c);
          *pdVar4 = INFINITY;
          pdVar4 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 9),(long)local_3c);
          *pdVar4 = 0.0;
          pdVar4 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 0xb),(long)local_3c);
          *pdVar4 = 0.0;
        }
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

Iterate::Iterate(const Model& model) : model_(model) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    x_.resize(n+m);
    xl_.resize(n+m);
    xu_.resize(n+m);
    y_.resize(m);
    zl_.resize(n+m);
    zu_.resize(n+m);
    rb_.resize(m);
    rl_.resize(n+m);
    ru_.resize(n+m);
    rc_.resize(n+m);
    variable_state_.resize(n+m);

    for (Int j = 0; j < n+m; j++) {
        if (std::isfinite(lb[j]) && std::isfinite(ub[j])) {
            variable_state_[j] = StateDetail::BARRIER_BOXED;
            xl_[j] = 1.0;
            xu_[j] = 1.0;
            zl_[j] = 1.0;
            zu_[j] = 1.0;
        } else if (std::isfinite(lb[j])) {
            variable_state_[j] = StateDetail::BARRIER_LB;
            xl_[j] = 1.0;
            xu_[j] = INFINITY;
            zl_[j] = 1.0;
            zu_[j] = 0.0;
        } else if (std::isfinite(ub[j])) {
            variable_state_[j] = StateDetail::BARRIER_UB;
            xl_[j] = INFINITY;
            xu_[j] = 1.0;
            zl_[j] = 0.0;
            zu_[j] = 1.0;
        } else {
            variable_state_[j] = StateDetail::FREE;
            xl_[j] = INFINITY;
            xu_[j] = INFINITY;
            zl_[j] = 0.0;
            zu_[j] = 0.0;
        }
    }
    assert_consistency();
}